

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleiter.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::RuleCharacterIterator::lookahead
          (RuleCharacterIterator *this,UnicodeString *result,int32_t maxLookAhead)

{
  UnicodeString *this_00;
  int32_t _length;
  int32_t *piVar1;
  
  _length = 0x7fffffff;
  if ((uint)maxLookAhead < 0x7fffffff) {
    _length = maxLookAhead;
  }
  this_00 = this->buf;
  if (this_00 == (UnicodeString *)0x0) {
    this_00 = this->text;
    piVar1 = &this->pos->index;
  }
  else {
    piVar1 = &this->bufPos;
  }
  UnicodeString::doExtract(this_00,*piVar1,_length,result);
  return result;
}

Assistant:

UnicodeString& RuleCharacterIterator::lookahead(UnicodeString& result, int32_t maxLookAhead) const {
    if (maxLookAhead < 0) {
        maxLookAhead = 0x7FFFFFFF;
    }
    if (buf != 0) {
        buf->extract(bufPos, maxLookAhead, result);
    } else {
        text.extract(pos.getIndex(), maxLookAhead, result);
    }
    return result;
}